

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O0

void updateVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *seqs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *seqs2,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *names,string *input_file,string *input_type)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  istream *piVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __lhs;
  reference pvVar5;
  ostream *poVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *in_R8;
  int i_3;
  int length;
  int j_5;
  istringstream ss_3;
  int j_4;
  istringstream ss_2;
  bool first_1;
  int i_2;
  string str_2;
  ifstream in_2;
  int j_3;
  istringstream ss_1;
  int j_2;
  istringstream ss;
  bool first;
  int i_1;
  string str_1;
  ifstream in_1;
  string temp2;
  string temp;
  int j_1;
  string str2_1;
  int j;
  string str2;
  bool newSeq;
  int i;
  string str;
  ifstream in;
  string type;
  value_type *in_stack_ffffffffffffef28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffef38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffef40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffef48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef58;
  int local_f80;
  string local_f78 [36];
  int local_f54;
  string local_f50 [32];
  char *local_f30;
  undefined8 local_f28;
  undefined8 local_f20;
  undefined8 local_f18;
  istringstream local_f10 [388];
  int local_d8c;
  char *local_d88;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 local_d70;
  istringstream local_d68 [384];
  string local_be8 [32];
  string local_bc8 [35];
  byte local_ba5;
  int local_ba4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  istream local_b80 [520];
  string local_978 [36];
  int local_954;
  string local_950 [32];
  char *local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  istringstream local_910 [388];
  int local_78c;
  char *local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  istringstream local_768 [384];
  string local_5e8 [35];
  byte local_5c5;
  int local_5c4;
  string local_5c0 [32];
  istream local_5a0 [520];
  string local_398 [32];
  string local_378 [36];
  int local_354;
  string local_350 [32];
  char *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  int local_30c;
  string local_308 [32];
  char *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  string local_2c8 [35];
  byte local_2a5;
  int local_2a4;
  string local_2a0 [32];
  istream local_280 [520];
  char *local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  string local_48 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_48,in_R8);
  local_50 = std::__cxx11::string::begin();
  local_58 = std::__cxx11::string::end();
  local_60 = std::__cxx11::string::begin();
  local_78 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                               (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                in_stack_ffffffffffffef38,(_func_int_int *)in_stack_ffffffffffffef30
                               );
  bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_280,pcVar3,_S_in);
    std::__cxx11::string::string(local_2a0);
    local_2a4 = -1;
    local_2a5 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_280,local_2a0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_2a0);
      if (*pcVar3 == '>') {
        local_2a5 = 1;
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_2a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
        std::__cxx11::string::~string(local_2c8);
      }
      else if ((local_2a5 & 1) == 1) {
        local_2d0 = std::__cxx11::string::begin();
        local_2d8 = std::__cxx11::string::end();
        local_2e0 = std::__cxx11::string::begin();
        local_2e8 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                       in_stack_ffffffffffffef38,
                                       (_func_int_int *)in_stack_ffffffffffffef30);
        std::__cxx11::string::string(local_308,local_2a0);
        local_30c = std::__cxx11::string::length();
        while (local_30c = local_30c + -1, -1 < local_30c) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_308);
          if (*pcVar3 == '-') {
            std::__cxx11::string::erase((ulong)local_308,(long)local_30c);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffef40._M_current,
                    (value_type *)in_stack_ffffffffffffef38._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffef40._M_current,
                    (value_type *)in_stack_ffffffffffffef38._M_current);
        local_2a4 = local_2a4 + 1;
        local_2a5 = 0;
        std::__cxx11::string::~string(local_308);
      }
      else {
        local_318 = std::__cxx11::string::begin();
        local_320 = std::__cxx11::string::end();
        local_328 = std::__cxx11::string::begin();
        local_330 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                       in_stack_ffffffffffffef38,
                                       (_func_int_int *)in_stack_ffffffffffffef30);
        std::__cxx11::string::string(local_350,local_2a0);
        local_354 = std::__cxx11::string::length();
        while (local_354 = local_354 + -1, -1 < local_354) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_350);
          if (*pcVar3 == '-') {
            std::__cxx11::string::erase((ulong)local_350,(long)local_354);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_10,(long)local_2a4);
        std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_10,(long)local_2a4);
        std::__cxx11::string::operator=((string *)pvVar5,local_378);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_8,(long)local_2a4);
        std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_8,(long)local_2a4);
        std::__cxx11::string::operator=((string *)pvVar5,local_398);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::string::~string(local_350);
      }
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_2a0);
    std::ifstream::~ifstream(local_280);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_5a0,pcVar3,_S_in);
      std::__cxx11::string::string(local_5c0);
      local_5c4 = 0;
      local_5c5 = 1;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_5a0,local_5c0);
      std::__cxx11::string::substr((ulong)local_5e8,(ulong)local_5c0);
      bVar1 = std::operator!=(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
      std::__cxx11::string::~string(local_5e8);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Not a valid CLUSTAL file!");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_5a0,local_5c0);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_5a0,local_5c0)
        ;
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_18);
        if ((sVar8 != 0) ||
           (bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28),
           !bVar1)) {
          bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
          if ((bVar1) ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_5c0), *pcVar3 == ' '))
          {
            local_5c5 = 0;
            local_5c4 = 0;
          }
          else if ((local_5c5 & 1) == 0) {
            std::__cxx11::istringstream::istringstream(local_910,local_5c0,_S_in);
            std::operator>>((istream *)local_910,local_5c0);
            std::operator>>((istream *)local_910,local_5c0);
            local_918 = std::__cxx11::string::begin();
            local_920 = std::__cxx11::string::end();
            local_928 = std::__cxx11::string::begin();
            local_930 = (char *)std::
                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                          (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                           in_stack_ffffffffffffef38,
                                           (_func_int_int *)in_stack_ffffffffffffef30);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_8,(long)local_5c4);
            std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_8,(long)local_5c4);
            std::__cxx11::string::operator=((string *)pvVar5,local_950);
            std::__cxx11::string::~string(local_950);
            local_954 = std::__cxx11::string::length();
            while (local_954 = local_954 + -1, -1 < local_954) {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_5c0);
              if (*pcVar3 == '-') {
                std::__cxx11::string::erase((ulong)local_5c0,(long)local_954);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_10,(long)local_5c4);
            std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_10,(long)local_5c4);
            std::__cxx11::string::operator=((string *)pvVar5,local_978);
            std::__cxx11::string::~string(local_978);
            local_5c4 = local_5c4 + 1;
            std::__cxx11::istringstream::~istringstream(local_910);
          }
          else {
            std::__cxx11::istringstream::istringstream(local_768,local_5c0,_S_in);
            std::operator>>((istream *)local_768,local_5c0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffef40._M_current,
                        (value_type *)in_stack_ffffffffffffef38._M_current);
            std::operator>>((istream *)local_768,local_5c0);
            local_770 = std::__cxx11::string::begin();
            local_778 = std::__cxx11::string::end();
            local_780 = std::__cxx11::string::begin();
            local_788 = (char *)std::
                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                          (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                           in_stack_ffffffffffffef38,
                                           (_func_int_int *)in_stack_ffffffffffffef30);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffef40._M_current,
                        (value_type *)in_stack_ffffffffffffef38._M_current);
            local_78c = std::__cxx11::string::length();
            while (local_78c = local_78c + -1, -1 < local_78c) {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_5c0);
              if (*pcVar3 == '-') {
                std::__cxx11::string::erase((ulong)local_5c0,(long)local_78c);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffef40._M_current,
                        (value_type *)in_stack_ffffffffffffef38._M_current);
            std::__cxx11::istringstream::~istringstream(local_768);
          }
        }
      }
      std::ifstream::close();
      std::__cxx11::string::~string(local_5c0);
      std::ifstream::~ifstream(local_5a0);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Please give valid input type");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_b80,pcVar3,_S_in);
      std::__cxx11::string::string((string *)&local_ba0);
      local_ba4 = 0;
      local_ba5 = 1;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_b80,(string *)&local_ba0)
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_b80,(string *)&local_ba0)
      ;
      while( true ) {
        std::__cxx11::string::substr((ulong)local_bc8,(ulong)&local_ba0);
        bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
        std::__cxx11::string::~string(local_bc8);
        if (!bVar1) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (local_b80,(string *)&local_ba0);
      }
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_b80,(string *)&local_ba0);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        std::__cxx11::string::substr((ulong)local_be8,(ulong)&local_ba0);
        bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
        std::__cxx11::string::~string(local_be8);
        if (bVar1) break;
        bVar1 = std::operator==(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28);
        if ((bVar1) ||
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_ba0), *pcVar3 == ' ')) {
          local_ba5 = 0;
          local_ba4 = 0;
        }
        else if ((local_ba5 & 1) == 0) {
          std::__cxx11::istringstream::istringstream(local_f10,(string *)&local_ba0,_S_in);
          std::operator>>((istream *)local_f10,(string *)&local_ba0);
          std::operator>>((istream *)local_f10,(string *)&local_ba0);
          __rhs = &local_ba0;
          local_f18 = std::__cxx11::string::begin();
          local_f20 = std::__cxx11::string::end();
          local_f28 = std::__cxx11::string::begin();
          __lhs = std::
                  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                            (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                             in_stack_ffffffffffffef38,(_func_int_int *)in_stack_ffffffffffffef30);
          local_f30 = __lhs._M_current;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_8,(long)local_ba4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __lhs._M_current,__rhs);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_8,(long)local_ba4);
          std::__cxx11::string::operator=((string *)pvVar5,local_f50);
          std::__cxx11::string::~string(local_f50);
          local_f54 = std::__cxx11::string::length();
          while (local_f54 = local_f54 + -1, -1 < local_f54) {
            in_stack_ffffffffffffef48._M_current =
                 (char *)std::__cxx11::string::operator[]((ulong)&local_ba0);
            if (*in_stack_ffffffffffffef48._M_current == '-') {
              std::__cxx11::string::erase((ulong)&local_ba0,(long)local_f54);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_10,(long)local_ba4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __lhs._M_current,__rhs);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_10,(long)local_ba4);
          std::__cxx11::string::operator=((string *)pvVar5,local_f78);
          std::__cxx11::string::~string(local_f78);
          local_ba4 = local_ba4 + 1;
          std::__cxx11::istringstream::~istringstream(local_f10);
        }
        else {
          std::__cxx11::istringstream::istringstream(local_d68,(string *)&local_ba0,_S_in);
          std::operator>>((istream *)local_d68,(string *)&local_ba0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffef40._M_current,
                      (value_type *)in_stack_ffffffffffffef38._M_current);
          std::operator>>((istream *)local_d68,(string *)&local_ba0);
          local_d70 = std::__cxx11::string::begin();
          local_d78 = std::__cxx11::string::end();
          local_d80 = std::__cxx11::string::begin();
          local_d88 = (char *)std::
                              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                        (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                         in_stack_ffffffffffffef38,
                                         (_func_int_int *)in_stack_ffffffffffffef30);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffef40._M_current,
                      (value_type *)in_stack_ffffffffffffef38._M_current);
          local_d8c = std::__cxx11::string::length();
          while (local_d8c = local_d8c + -1, -1 < local_d8c) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_ba0);
            if (*pcVar3 == '-') {
              std::__cxx11::string::erase((ulong)&local_ba0,(long)local_d8c);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffef40._M_current,
                      (value_type *)in_stack_ffffffffffffef38._M_current);
          std::__cxx11::istringstream::~istringstream(local_d68);
        }
      }
      std::__cxx11::string::~string((string *)&local_ba0);
      std::ifstream::~ifstream(local_b80);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_8,0);
  iVar2 = std::__cxx11::string::length();
  local_f80 = 0;
  while( true ) {
    uVar7 = (ulong)local_f80;
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_8);
    if (sVar8 <= uVar7) {
      std::__cxx11::string::~string(local_48);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_8,(long)local_f80);
    lVar9 = std::__cxx11::string::length();
    if (lVar9 != iVar2) break;
    local_f80 = local_f80 + 1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "All sequences must be the same length in the alignment");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

void updateVectors(std::vector<std::string> & seqs, std::vector<std::string> &seqs2, std::vector<std::string> & names, const std::string & input_file, const std::string& input_type){
    std::string type = input_type;
    std::transform(type.begin(), type.end(), type.begin(), ::toupper);
    // Get the arguments
    if(type == "FASTA"){

        std::ifstream in(input_file.c_str());
        std::string str;
        int i = -1;
        bool newSeq = false;
        while (std::getline(in, str)) {

            if(str[0] == '>'){
                newSeq = true;
                names.push_back(str.substr(1,str.length()));
                continue;
            } 
            
            if(newSeq == true) {
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);

                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                seqs2.push_back(str2);
                seqs.push_back(str);
                i++;
                newSeq = false;
            }
            else{
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                std::string temp = seqs2[i] + str2;
                seqs2[i] = temp;
                std::string temp2 = seqs[i] + str;
                seqs[i] = temp2;
            }
        }
        in.close();

    }else if(type == "CLUSTAL"){
        
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;

        bool first = true;
        std::getline(in, str);
        if(str.substr(0,7) != "CLUSTAL"){
            std::cout << "Not a valid CLUSTAL file!" << std::endl;
            exit (EXIT_FAILURE);
        }
        std::getline(in, str);
        while (std::getline(in, str)) {
            if(names.size() == 0 && str == "") continue;

            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }
        in.close();
    }
    else if(type == "STOCKHOLM"){
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;
        bool first = true;
        std::getline(in,str);
        getline(in,str);
        while(str.substr(0,4) == "#=GF"){
            getline(in,str);
        }
        while(getline(in,str)){

            if(str.substr(0,4) == "#=GC") break;
            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }

    }
    else{
        std::cout << "Please give valid input type" << std::endl;
        exit (EXIT_FAILURE);
    }
    int length = seqs[0].length();
    for(int i=0;i<seqs.size();++i){
        if (seqs[i].length() != length){
            std::cout << "All sequences must be the same length in the alignment" << std::endl;
            exit(0);
        }
    }
}